

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Serializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP3Serializer::AggregateCollectiveMetadata
          (BP3Serializer *this,Comm *comm,BufferSTL *bufferSTL,bool inMetadataBuffer)

{
  size_t *psVar1;
  _func_int *p_Var2;
  int iVar3;
  undefined7 in_register_00000009;
  size_t size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indicesPosition;
  allocator local_ed;
  undefined4 local_ec;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_ec = (undefined4)CONCAT71(in_register_00000009,inMetadataBuffer);
  p_Var2 = (this->super_BP3Base)._vptr_BP3Base[-3];
  std::__cxx11::string::string((string *)&local_50,"buffering",(allocator *)&local_e8);
  profiling::IOChrono::Start
            ((IOChrono *)(&(this->super_BP3Base).field_0x278 + (long)p_Var2),&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  p_Var2 = (this->super_BP3Base)._vptr_BP3Base[-3];
  std::__cxx11::string::string((string *)&local_70,"meta_sort_merge",(allocator *)&local_e8);
  profiling::IOChrono::Start
            ((IOChrono *)(&(this->super_BP3Base).field_0x278 + (long)p_Var2),&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  AggregateCollectiveMetadataIndices
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,this,comm,bufferSTL)
  ;
  iVar3 = helper::Comm::Rank(comm);
  if (iVar3 == 0) {
    BPSerializer::PutMinifooter
              ((BPSerializer *)&(this->super_BP3Base).field_0x8,
               *local_e8._M_impl.super__Vector_impl_data._M_start,
               local_e8._M_impl.super__Vector_impl_data._M_start[1],
               local_e8._M_impl.super__Vector_impl_data._M_start[2],&bufferSTL->m_Buffer,
               &(bufferSTL->super_Buffer).m_Position,SUB41(local_ec,0));
    size = (bufferSTL->super_Buffer).m_Position;
    if ((char)local_ec == '\0') {
      psVar1 = &(bufferSTL->super_Buffer).m_AbsolutePosition;
      *psVar1 = *psVar1 + size;
    }
    else {
      (bufferSTL->super_Buffer).m_AbsolutePosition = size;
    }
  }
  else {
    size = (bufferSTL->super_Buffer).m_Position;
  }
  std::__cxx11::string::string((string *)&local_90,"after collective metadata is done",&local_ed);
  BufferSTL::Resize(bufferSTL,size,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  p_Var2 = (this->super_BP3Base)._vptr_BP3Base[-3];
  std::__cxx11::string::string((string *)&local_b0,"meta_sort_merge",&local_ed);
  profiling::IOChrono::Stop
            ((IOChrono *)(&(this->super_BP3Base).field_0x278 + (long)p_Var2),&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  p_Var2 = (this->super_BP3Base)._vptr_BP3Base[-3];
  std::__cxx11::string::string((string *)&local_d0,"buffering",&local_ed);
  profiling::IOChrono::Stop
            ((IOChrono *)(&(this->super_BP3Base).field_0x278 + (long)p_Var2),&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_e8);
  return;
}

Assistant:

void BP3Serializer::AggregateCollectiveMetadata(helper::Comm const &comm, BufferSTL &bufferSTL,
                                                const bool inMetadataBuffer)
{
    m_Profiler.Start("buffering");
    m_Profiler.Start("meta_sort_merge");

    const std::vector<size_t> indicesPosition = AggregateCollectiveMetadataIndices(comm, bufferSTL);

    int rank = comm.Rank();
    if (rank == 0)
    {
        PutMinifooter(static_cast<uint64_t>(indicesPosition[0]),
                      static_cast<uint64_t>(indicesPosition[1]),
                      static_cast<uint64_t>(indicesPosition[2]), bufferSTL.m_Buffer,
                      bufferSTL.m_Position, inMetadataBuffer);

        if (inMetadataBuffer)
        {
            bufferSTL.m_AbsolutePosition = bufferSTL.m_Position;
        }
        else
        {
            bufferSTL.m_AbsolutePosition += bufferSTL.m_Position;
        }
    }

    bufferSTL.Resize(bufferSTL.m_Position, "after collective metadata is done");

    m_Profiler.Stop("meta_sort_merge");
    m_Profiler.Stop("buffering");
}